

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * __thiscall CTPNListBase::adjust_for_dyn(CTPNListBase *this,tcpn_dyncomp_info *info)

{
  undefined8 in_RSI;
  CTcPrsNode *in_RDI;
  CTPNListEle *cur;
  CTPNListEleBase *local_18;
  
  for (local_18 = (CTPNListEleBase *)in_RDI[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase;
      local_18 != (CTPNListEleBase *)0x0;
      local_18 = &CTPNListEleBase::get_next(local_18)->super_CTPNListEleBase) {
    (*(local_18->super_CTcPrsNode).super_CTcPrsNodeBase._vptr_CTcPrsNodeBase[0x11])(local_18,in_RSI)
    ;
  }
  *(byte *)&in_RDI[9].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
       *(byte *)&in_RDI[9].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase & 0xfe;
  return in_RDI;
}

Assistant:

CTcPrsNode *CTPNListBase::adjust_for_dyn(const tcpn_dyncomp_info *info)
{
    CTPNListEle *cur;

    /* run through my list and adjust each element */
    for (cur = head_ ; cur != 0 ; cur = cur->get_next())
    {
        /* adjust this element */
        cur->adjust_for_dyn(info);
    }

    /* 
     *   force the list to be non-constant - in debugger mode, we have to
     *   build the value we push as a dynamic object, never as an actual
     *   constant, to ensure that the generated code can be deleted
     *   immediately after being executed 
     */
    is_const_ = FALSE;

    /* return myself */
    return this;
}